

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

HttpClient * __thiscall
kj::anon_unknown_31::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  String *pSVar1;
  size_t sVar2;
  _Base_ptr p_Var3;
  PromiseNode *pPVar4;
  Exception *pEVar5;
  HttpHeaderTable *pHVar6;
  Duration DVar7;
  Fault FVar8;
  NetworkHttpClient *pNVar9;
  Url *pUVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  TransformPromiseNodeBase *pTVar14;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var15;
  undefined8 in_RCX;
  long lVar16;
  _Base_ptr p_Var17;
  _Rb_tree_node_base *p_Var18;
  _Base_ptr p_Var19;
  Maybe<kj::EntropySource_&> MVar20;
  Network *pNVar21;
  _Link_type __p;
  undefined8 uVar22;
  iterator iter;
  char *__s2;
  _Rb_tree_node_base *__x;
  Fault f;
  Host host;
  Own<kj::_::PromiseNode> local_c8;
  Exception *local_b8;
  HttpHeaderTable *pHStack_b0;
  _Base_ptr local_a8;
  Maybe<kj::Network_&> MStack_a0;
  Duration local_98;
  Maybe<kj::EntropySource_&> local_90;
  Own<kj::_::PromiseNode> local_88;
  Fault local_78;
  HttpHeaderTable *pHStack_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  undefined4 local_44;
  NetworkHttpClient *local_40;
  Url *local_38;
  
  sVar2 = (parsed->scheme).content.size_;
  lVar16 = sVar2 + (sVar2 == 0);
  if (sVar2 == 5) {
    iVar13 = bcmp((parsed->scheme).content.ptr,"http",lVar16 - 1);
    bVar11 = iVar13 == 0;
    local_44 = 0;
  }
  else {
    if (sVar2 == 6) {
      iVar13 = bcmp((parsed->scheme).content.ptr,"https",lVar16 - 1);
      local_44 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),iVar13 == 0);
    }
    else {
      local_44 = 0;
    }
    bVar11 = false;
  }
  if (((char)local_44 == '\0') && (!bVar11)) {
    local_78.exception = (Exception *)0x0;
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    _::Debug::Fault::init
              (&local_78,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
              );
    _::Debug::Fault::fatal(&local_78);
  }
  iter._M_node = (_Base_ptr)&this->httpHosts;
  if ((char)local_44 != '\0') {
    iter._M_node = (_Base_ptr)&this->httpsHosts;
  }
  sVar2 = (parsed->host).content.size_;
  if (sVar2 == 0) {
    __s2 = "";
  }
  else {
    __s2 = (parsed->host).content.ptr;
  }
  p_Var19 = (_Base_ptr)(sVar2 + (sVar2 == 0));
  p_Var18 = (iter._M_node)->_M_left;
  p_Var15 = (_Rb_tree_node_base *)&(iter._M_node)->_M_parent;
  local_90.ptr = (EntropySource *)p_Var15;
  local_40 = this;
  local_38 = parsed;
  if (p_Var18 != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var3 = p_Var18[1]._M_parent;
      p_Var17 = p_Var19;
      if (p_Var3 < p_Var19) {
        p_Var17 = p_Var3;
      }
      iVar13 = memcmp(*(void **)(p_Var18 + 1),__s2,(size_t)p_Var17);
      this = local_40;
      lVar16 = 0x18;
      if (-1 < iVar13) {
        if (iVar13 != 0 || p_Var3 >= p_Var19) {
          p_Var15 = p_Var18;
        }
        lVar16 = (ulong)(iVar13 == 0 && p_Var3 < p_Var19) * 8 + 0x10;
      }
      p_Var18 = *(_Rb_tree_node_base **)((long)&p_Var18->_M_color + lVar16);
    } while (p_Var18 != (_Rb_tree_node_base *)0x0);
    if (p_Var15 != (_Rb_tree_node_base *)local_90.ptr) {
      p_Var3 = p_Var15[1]._M_parent;
      p_Var17 = p_Var3;
      if (p_Var19 < p_Var3) {
        p_Var17 = p_Var19;
      }
      iVar13 = memcmp(__s2,*(void **)(p_Var15 + 1),(size_t)p_Var17);
      if ((-1 < iVar13) && (iVar13 != 0 || p_Var3 <= p_Var19)) goto LAB_002d73c9;
    }
  }
  if ((char)local_44 == '\0') {
    pNVar21 = this->network;
    uVar22 = 0x50;
  }
  else {
    pNVar21 = (this->tlsNetwork).ptr;
    uVar22 = 0x1bb;
    if (pNVar21 == (Network *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                ((Fault *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xf34,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support HTTPS\"",
                 (char (*) [38])"this HttpClient doesn\'t support HTTPS");
      _::Debug::Fault::fatal((Fault *)&local_c8);
    }
  }
  (**pNVar21->_vptr_Network)(&local_c8,pNVar21,__s2,p_Var19,uVar22);
  pTVar14 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar14,&local_c8,
             _::
             TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3896:17),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pUVar10 = local_38;
  pPVar4 = local_c8.ptr;
  pSVar1 = &local_38->host;
  (pTVar14->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00444f30;
  pTVar14[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
  if (local_c8.ptr != (PromiseNode *)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    (**(local_c8.disposer)->_vptr_Disposer)
              (local_c8.disposer,(_func_int *)((long)pPVar4 + (long)pPVar4->_vptr_PromiseNode[-2]));
  }
  local_78.exception = (Exception *)(pUVar10->host).content.ptr;
  pHStack_70 = (HttpHeaderTable *)(pUVar10->host).content.size_;
  local_68 = (_Base_ptr)(pUVar10->host).content.disposer;
  (pSVar1->content).ptr = (char *)0x0;
  (pUVar10->host).content.size_ = 0;
  p_Var19 = (_Base_ptr)operator_new(0x30);
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::{lambda(kj::Own<kj::NetworkAddress>)#1},kj::_::PropagateException>>
        ::instance;
  *(undefined ***)p_Var19 = &PTR_request_00444fb8;
  local_88.ptr = (PromiseNode *)pTVar14;
  pTVar14 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar14,&local_88,
             _::
             TransformPromiseNode<kj::_::Void,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3735:30),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar14->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00444ff8;
  pTVar14[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)p_Var19;
  local_c8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>)::{lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (PromiseNode *)pTVar14;
  Promise<void>::fork((Promise<void> *)&p_Var19->_M_parent);
  pPVar4 = local_c8.ptr;
  if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    (**(local_c8.disposer)->_vptr_Disposer)
              (local_c8.disposer,(long)pPVar4 + *(long *)(*(_func_int **)pPVar4 + -0x10));
  }
  pPVar4 = local_88.ptr;
  p_Var19->_M_right = (_Base_ptr)0x0;
  *(_func_int **)(p_Var19 + 1) = (_func_int *)0x0;
  *(undefined1 *)&p_Var19[1]._M_parent = 0;
  local_60 = (_Base_ptr)
             &_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::instance;
  local_98.value = (long)p_Var19;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    local_58 = p_Var19;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
    local_98.value = (long)local_58;
  }
  local_c8.disposer = (Disposer *)(Exception *)0x36d124;
  if (pHStack_70 != (HttpHeaderTable *)0x0) {
    local_c8.disposer = (Disposer *)local_78.exception;
  }
  local_c8.ptr = (PromiseNode *)
                 ((long)&(pHStack_70->namesById).builder.ptr +
                 (ulong)(pHStack_70 == (HttpHeaderTable *)0x0));
  local_b8 = local_78.exception;
  pHStack_b0 = pHStack_70;
  local_a8 = local_68;
  local_78.exception = (Exception *)0x0;
  pHStack_70 = (HttpHeaderTable *)0x0;
  local_58 = (_Base_ptr)0x0;
  MStack_a0.ptr = (Network *)local_60;
  this_00 = (_Rb_tree_node_base *)operator_new(0x58);
  __x = this_00 + 1;
  *(Disposer **)(this_00 + 1) = local_c8.disposer;
  this_00[1]._M_parent = (_Base_ptr)local_c8.ptr;
  this_00[1]._M_left = (_Base_ptr)local_b8;
  this_00[1]._M_right = (_Base_ptr)pHStack_b0;
  local_b8 = (Exception *)0x0;
  pHStack_b0 = (HttpHeaderTable *)0x0;
  *(_Base_ptr *)(this_00 + 2) = local_a8;
  this_00[2]._M_parent = (_Base_ptr)MStack_a0.ptr;
  this_00[2]._M_left = (_Base_ptr)local_98.value;
  local_98.value = 0;
  p_Var18 = (iter._M_node)->_M_left;
  MVar20.ptr = local_90.ptr;
  if ((iter._M_node)->_M_left == (_Rb_tree_node_base *)0x0) {
LAB_002d7264:
    if ((_Rb_tree_node_base *)MVar20.ptr != (iter._M_node)->_M_right) {
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_decrement((_Rb_tree_node_base *)MVar20.ptr);
      goto LAB_002d7275;
    }
LAB_002d7288:
    bVar11 = true;
    bVar12 = true;
    if (local_90.ptr != MVar20.ptr) {
      bVar12 = std::less<kj::StringPtr>::operator()
                         ((less<kj::StringPtr> *)iter._M_node,(StringPtr *)__x,
                          (StringPtr *)((long)MVar20.ptr + 0x20));
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar12,this_00,(_Rb_tree_node_base *)MVar20.ptr,(_Rb_tree_node_base *)local_90.ptr);
    iter._M_node[1]._M_parent = (_Base_ptr)((long)&(iter._M_node[1]._M_parent)->_M_color + 1);
    p_Var15 = this_00;
  }
  else {
    do {
      p_Var15 = p_Var18;
      bVar11 = std::less<kj::StringPtr>::operator()
                         ((less<kj::StringPtr> *)iter._M_node,(StringPtr *)__x,
                          (StringPtr *)(p_Var15 + 1));
      p_Var18 = (&p_Var15->_M_left)[!bVar11];
    } while ((&p_Var15->_M_left)[!bVar11] != (_Base_ptr)0x0);
    MVar20.ptr = (EntropySource *)p_Var15;
    if (bVar11) goto LAB_002d7264;
LAB_002d7275:
    __p = (_Link_type)(p_Var15 + 1);
    bVar11 = std::less<kj::StringPtr>::operator()
                       ((less<kj::StringPtr> *)iter._M_node,(StringPtr *)__p,(StringPtr *)__x);
    if (bVar11) goto LAB_002d7288;
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_drop_node((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                    *)this_00,__p);
    bVar11 = false;
  }
  DVar7.value = local_98.value;
  if ((long *)local_98.value != (long *)0x0) {
    local_98.value = 0;
    (**(MStack_a0.ptr)->_vptr_Network)(MStack_a0.ptr,DVar7.value + *(long *)(*DVar7.value + -0x10));
  }
  pHVar6 = pHStack_b0;
  pEVar5 = local_b8;
  if (local_b8 != (Exception *)0x0) {
    local_b8 = (Exception *)0x0;
    pHStack_b0 = (HttpHeaderTable *)0x0;
    (***(_func_int ***)local_a8)(local_a8,pEVar5,1,pHVar6,pHVar6,0);
  }
  pNVar9 = local_40;
  if (!bVar11) {
    local_88.disposer = (Disposer *)0x0;
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
  handleCleanup((NetworkHttpClient *)&local_c8,
                (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 *)local_40,iter);
  TaskSet::add(&pNVar9->tasks,(Promise<void> *)&local_c8);
  pPVar4 = local_c8.ptr;
  if ((_Base_ptr)local_c8.ptr != (_Base_ptr)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    (**(code **)*(_func_int **)local_c8.disposer)
              (local_c8.disposer,(long)pPVar4 + *(long *)(*(_func_int **)pPVar4 + -0x10));
  }
  p_Var19 = local_58;
  if (local_58 != (_Base_ptr)0x0) {
    local_58 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)local_60)
              (local_60,(long)p_Var19 + *(long *)(*(long *)p_Var19 + -0x10));
  }
  pHVar6 = pHStack_70;
  FVar8.exception = local_78.exception;
  if (local_78.exception != (Exception *)0x0) {
    local_78.exception = (Exception *)0x0;
    pHStack_70 = (HttpHeaderTable *)0x0;
    (***(_func_int ***)local_68)(local_68,FVar8.exception,1,pHVar6,pHVar6,0);
  }
LAB_002d73c9:
  return (HttpClient *)p_Var15[2]._M_left;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }